

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O2

void __thiscall Tag::~Tag(Tag *this)

{
  pointer ppSVar1;
  StreamObject *this_00;
  uint uVar2;
  ulong uVar3;
  
  (this->super_StreamObject)._vptr_StreamObject = (_func_int **)&PTR_write_0010ab70;
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    ppSVar1 = (this->_streamObjects).
              super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_streamObjects).
                      super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar3) break;
    this_00 = ppSVar1[uVar3];
    if (this_00 != (StreamObject *)0x0) {
      StreamObject::~StreamObject(this_00);
      operator_delete(this_00,0x40);
      (this->_streamObjects).super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar3] = (StreamObject *)0x0;
    }
    uVar2 = uVar2 + 1;
  }
  std::_Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>::~_Vector_base
            (&(this->_streamObjects).
              super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>);
  StreamObject::~StreamObject(&this->super_StreamObject);
  return;
}

Assistant:

Tag::~Tag()
{
	//std::cout << __PRETTY_FUNCTION__ << std::endl;

	for ( unsigned int i = 0; i < _streamObjects.size();i++ )
	{
		if ( _streamObjects[i] != NULL )
		{
			delete _streamObjects[i];
			_streamObjects[i] = NULL;
		}
	}
}